

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
::nosize_unchecked_emplace_at<std::__cxx11::string>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  group_type_pointer pgVar2;
  pointer pcVar3;
  uint uVar4;
  ushort uVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  group_type_pointer pgVar9;
  undefined8 *puVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  group_type_pointer pgVar12;
  undefined1 auVar13 [16];
  
  pgVar9 = __return_storage_ptr__->pg;
  paVar1 = &args->field_2;
  uVar8 = (ulong)__return_storage_ptr__->n;
  pbVar11 = __return_storage_ptr__->p;
  lVar7 = 1;
  while( true ) {
    pgVar12 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar13[0] = -(pgVar2->m[0].n == '\0');
    auVar13[1] = -(pgVar2->m[1].n == '\0');
    auVar13[2] = -(pgVar2->m[2].n == '\0');
    auVar13[3] = -(pgVar2->m[3].n == '\0');
    auVar13[4] = -(pgVar2->m[4].n == '\0');
    auVar13[5] = -(pgVar2->m[5].n == '\0');
    auVar13[6] = -(pgVar2->m[6].n == '\0');
    auVar13[7] = -(pgVar2->m[7].n == '\0');
    auVar13[8] = -(pgVar2->m[8].n == '\0');
    auVar13[9] = -(pgVar2->m[9].n == '\0');
    auVar13[10] = -(pgVar2->m[10].n == '\0');
    auVar13[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar13[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar13[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar13[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar13[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar5 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
    if (uVar5 == 0) {
      pgVar12->m[0xf].n = pgVar12->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar4 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar8 = (ulong)uVar4;
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&arrays_->elements_[pos0 * 0xf]._M_dataplus._M_p + (ulong)(uVar4 << 5));
      puVar10 = (undefined8 *)
                ((long)&arrays_->elements_[pos0 * 0xf]._M_dataplus._M_p + (ulong)(uVar4 << 5));
      *puVar10 = puVar10 + 2;
      pcVar3 = (args->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 == paVar1) {
        uVar6 = *(undefined8 *)((long)&args->field_2 + 8);
        puVar10[2] = paVar1->_M_allocated_capacity;
        puVar10[3] = uVar6;
      }
      else {
        (pbVar11->_M_dataplus)._M_p = pcVar3;
        (pbVar11->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      pbVar11->_M_string_length = args->_M_string_length;
      (args->_M_dataplus)._M_p = (pointer)paVar1;
      args->_M_string_length = 0;
      (args->field_2)._M_local_buf[0] = '\0';
      pgVar12->m[uVar8].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar9 = pgVar12;
    }
    if (uVar5 != 0) break;
    pos0 = pos0 + lVar7 & arrays_->groups_size_mask;
    lVar7 = lVar7 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar8;
  __return_storage_ptr__->p = pbVar11;
  __return_storage_ptr__->pg = pgVar9;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }